

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t
flatcc_builder_create_table
          (flatcc_builder_t *B,void *data,size_t size,uint16_t align,flatbuffers_voffset_t *offsets,
          int offset_count,flatcc_builder_vt_ref_t vt_ref)

{
  int iVar1;
  undefined1 local_f0 [8];
  flatcc_iov_state_t iov;
  flatbuffers_uoffset_t *offset_field;
  flatbuffers_uoffset_t offset;
  flatbuffers_uoffset_t base;
  flatbuffers_uoffset_t vt_base;
  flatbuffers_uoffset_t vt_offset_field;
  flatbuffers_uoffset_t vt_offset;
  flatbuffers_uoffset_t pad;
  int i;
  int offset_count_local;
  flatbuffers_voffset_t *offsets_local;
  void *pvStack_28;
  uint16_t align_local;
  size_t size_local;
  void *data_local;
  flatcc_builder_t *B_local;
  
  pad = offset_count;
  _i = offsets;
  offsets_local._6_2_ = align;
  pvStack_28 = (void *)size;
  size_local = (size_t)data;
  data_local = B;
  if (offset_count < 0) {
    __assert_fail("offset_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x4ea,
                  "flatcc_builder_ref_t flatcc_builder_create_table(flatcc_builder_t *, const void *, size_t, uint16_t, flatbuffers_voffset_t *, int, flatcc_builder_vt_ref_t)"
                 );
  }
  if ((vt_ref & 1U) != 0) {
    get_min_align((uint16_t *)((long)&offsets_local + 6),4);
    set_min_align((flatcc_builder_t *)data_local,offsets_local._6_2_);
    vt_offset_field =
         front_pad((flatcc_builder_t *)data_local,(flatbuffers_uoffset_t)pvStack_28,
                   offsets_local._6_2_);
    iVar1 = *(int *)((long)data_local + 0xf0) - (vt_offset_field + (int)pvStack_28 + 4);
    vt_base = iVar1 - (vt_ref + -1);
    if (iVar1 - vt_base == vt_ref + -1) {
      __flatbuffers_uoffset_write_to_pe(&base,vt_base);
      for (vt_offset = 0; (int)vt_offset < (int)pad; vt_offset = vt_offset + 1) {
        iov.iov[7].iov_len = size_local + _i[(int)vt_offset];
        __flatbuffers_uoffset_write_to_pe
                  ((void *)iov.iov[7].iov_len,
                   ((*(int *)iov.iov[7].iov_len - iVar1) - (uint)_i[(int)vt_offset]) - 4);
      }
      local_f0 = (undefined1  [8])0x4;
      iov._8_8_ = &base;
      iov.iov[0].iov_base = (void *)0x4;
      iov.len._0_4_ = 1;
      if (pvStack_28 != (void *)0x0) {
        local_f0 = (undefined1  [8])((long)pvStack_28 + 4);
        iov.iov[0].iov_len = size_local;
        iov.iov[1].iov_base = pvStack_28;
        iov.len._0_4_ = 2;
      }
      if (vt_offset_field != 0) {
        local_f0 = (undefined1  [8])((ulong)vt_offset_field + (long)local_f0);
        iov.iov[(long)(int)iov.len + -1].iov_len = (size_t)"";
        iov.iov[(int)iov.len].iov_base = (void *)(ulong)vt_offset_field;
        iov.len._0_4_ = (int)iov.len + 1;
      }
      B_local._4_4_ = emit_front((flatcc_builder_t *)data_local,(flatcc_iov_state_t *)local_f0);
    }
    else {
      B_local._4_4_ = -1;
    }
    return B_local._4_4_;
  }
  __assert_fail("vt_ref & 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x4f0,
                "flatcc_builder_ref_t flatcc_builder_create_table(flatcc_builder_t *, const void *, size_t, uint16_t, flatbuffers_voffset_t *, int, flatcc_builder_vt_ref_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_table(flatcc_builder_t *B, const void *data, size_t size, uint16_t align,
        flatbuffers_voffset_t *offsets, int offset_count, flatcc_builder_vt_ref_t vt_ref)
{
    int i;
    uoffset_t pad, vt_offset, vt_offset_field, vt_base, base, offset, *offset_field;
    iov_state_t iov;

    check(offset_count >= 0, "expected non-negative offset_count");
    /*
     * vtable references are offset by 1 to avoid confusion with
     * 0 as an error reference. It also uniquely identifies them
     * as vtables being the only uneven reference type.
     */
    check(vt_ref & 1, "invalid vtable referenc");
    get_min_align(&align, field_size);
    set_min_align(B, align);
    /* Alignment is calculated for the first element, not the header. */
    pad = front_pad(B, (uoffset_t)size, align);
    base = (uoffset_t)B->emit_start - (uoffset_t)(pad + size + field_size);
    /* Adjust by 1 to get unencoded vtable reference. */
    vt_base = (uoffset_t)(vt_ref - 1);
    vt_offset = base - vt_base;
    /* Avoid overflow. */
    if (base - vt_offset != vt_base) {
        return -1;
    }
    /* Protocol endian encoding. */
    write_uoffset(&vt_offset_field, vt_offset);
    for (i = 0; i < offset_count; ++i) {
        offset_field = (uoffset_t *)((size_t)data + offsets[i]);
        offset = *offset_field - base - offsets[i] - (uoffset_t)field_size;
        write_uoffset(offset_field, offset);
    }
    init_iov();
    push_iov(&vt_offset_field, field_size);
    push_iov(data, size);
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}